

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleShadingRenderingCase::init
          (SampleShadingRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  ContextInfo *this_00;
  NotSupportedError *pNVar4;
  RenderTarget *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar5;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_1f8;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  SampleShadingRenderingCase *local_10;
  SampleShadingRenderingCase *this_local;
  
  local_10 = this;
  pRVar3 = gles31::Context::getRenderContext
                     ((this->super_MultisampleRenderCase).super_TestCase.m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
  if (!bVar1) {
    this_00 = gles31::Context::getContextInfo
                        ((this->super_MultisampleRenderCase).super_TestCase.m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_sample_shading");
    if (!bVar1) {
      local_4d = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,
                 "Test requires GL_OES_sample_shading extension or a context version 3.2 or higher."
                 ,&local_39);
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
      local_4d = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if ((this->super_MultisampleRenderCase).m_renderTarget == TARGET_DEFAULT) {
    this_01 = gles31::Context::getRenderTarget
                        ((this->super_MultisampleRenderCase).super_TestCase.m_context);
    iVar2 = tcu::RenderTarget::getNumSamples(this_01);
    if (iVar2 < 2) {
      local_72 = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Multisampled default framebuffer required",&local_71);
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_70);
      local_72 = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_02 = tcu::TestContext::getLog
                      ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1f8,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_1f8,
                      (char (*) [108])
                      "Verifying that a varying is given at least N different values for different samples within a single pixel.\n"
                     );
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [97])
                             "\tRender high-frequency function, map result to black/white. Modify N with glMinSampleShading().\n"
                     );
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [56])
                             "\t=> Resulting image should contain N+1 shades of gray.\n");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1f8);
  MultisampleShaderRenderUtil::MultisampleRenderCase::init
            (&this->super_MultisampleRenderCase,ctx_00);
  (this->super_MultisampleRenderCase).m_numIterations =
       (this->super_MultisampleRenderCase).m_numTargetSamples + 1;
  return (int)this;
}

Assistant:

void SampleShadingRenderingCase::init (void)
{
	// requirements

	if (!contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_OES_sample_shading"))
		throw tcu::NotSupportedError("Test requires GL_OES_sample_shading extension or a context version 3.2 or higher.");
	if (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() <= 1)
		throw tcu::NotSupportedError("Multisampled default framebuffer required");

	// test purpose and expectations
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that a varying is given at least N different values for different samples within a single pixel.\n"
		<< "	Render high-frequency function, map result to black/white. Modify N with glMinSampleShading().\n"
		<< "	=> Resulting image should contain N+1 shades of gray.\n"
		<< tcu::TestLog::EndMessage;

	// setup resources

	MultisampleShaderRenderUtil::MultisampleRenderCase::init();

	// set iterations

	m_numIterations = m_numTargetSamples + 1;
}